

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tt_PackSetOversampling(nk_tt_pack_context *spc,uint h_oversample,uint v_oversample)

{
  uint v_oversample_local;
  uint h_oversample_local;
  nk_tt_pack_context *spc_local;
  
  if (8 < h_oversample) {
    __assert_fail("h_oversample <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2fb2,
                  "void nk_tt_PackSetOversampling(struct nk_tt_pack_context *, unsigned int, unsigned int)"
                 );
  }
  if (v_oversample < 9) {
    if (h_oversample < 9) {
      spc->h_oversample = h_oversample;
    }
    if (v_oversample < 9) {
      spc->v_oversample = v_oversample;
    }
    return;
  }
  __assert_fail("v_oversample <= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x2fb3,
                "void nk_tt_PackSetOversampling(struct nk_tt_pack_context *, unsigned int, unsigned int)"
               );
}

Assistant:

NK_INTERN void
nk_tt_PackSetOversampling(struct nk_tt_pack_context *spc,
    unsigned int h_oversample, unsigned int v_oversample)
{
   NK_ASSERT(h_oversample <= NK_TT_MAX_OVERSAMPLE);
   NK_ASSERT(v_oversample <= NK_TT_MAX_OVERSAMPLE);
   if (h_oversample <= NK_TT_MAX_OVERSAMPLE)
      spc->h_oversample = h_oversample;
   if (v_oversample <= NK_TT_MAX_OVERSAMPLE)
      spc->v_oversample = v_oversample;
}